

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

bool tcu::boolAll<3>(Vector<bool,_3> *a)

{
  int local_1c;
  int i;
  Vector<bool,_3> *a_local;
  
  local_1c = 0;
  while( true ) {
    if (2 < local_1c) {
      return true;
    }
    if ((a->m_data[local_1c] & 1U) == 0) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

inline bool boolAll (const Vector<bool, Size>& a)
{
	for (int i = 0; i < Size; i++)
		if (a.m_data[i] == false)
			return false;
	return true;
}